

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::mark_implicit_builtin
          (CompilerMSL *this,StorageClass storage,BuiltIn builtin,uint32_t id)

{
  size_t sVar1;
  SPIREntryPoint *pSVar2;
  TypedID<(spirv_cross::Types)2> *pTVar3;
  long lVar4;
  char *pcVar5;
  __node_gen_type __node_gen;
  BuiltIn local_1c;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_18;
  
  lVar4 = 0xa78;
  if (storage != StorageClassInput) {
    if (storage != StorageClassOutput) {
      __assert_fail("active_builtins != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x41b,
                    "void spirv_cross::CompilerMSL::mark_implicit_builtin(StorageClass, BuiltIn, uint32_t)"
                   );
    }
    lVar4 = 0xab8;
  }
  pcVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids.stack_storage.aligned_char +
           lVar4 + -0x40;
  local_1c = builtin;
  if (builtin < 0x40) {
    *(ulong *)pcVar5 = *(ulong *)pcVar5 | 1L << ((byte)builtin & 0x3f);
  }
  else {
    local_18 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)(pcVar5 + 8);
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              (local_18,&local_1c);
  }
  pSVar2 = Compiler::get_entry_point((Compiler *)this);
  pTVar3 = (pSVar2->interface_variables).
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
  local_18 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)CONCAT44(local_18._4_4_,id);
  pTVar3 = ::std::
           __find_if<spirv_cross::TypedID<(spirv_cross::Types)2>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)2>const>>
                     (pTVar3,pTVar3 + (pSVar2->interface_variables).
                                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
                                      .buffer_size);
  sVar1 = (pSVar2->interface_variables).
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
  if (pTVar3 == (pSVar2->interface_variables).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr + sVar1) {
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
              (&pSVar2->interface_variables,sVar1 + 1);
    sVar1 = (pSVar2->interface_variables).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
    (pSVar2->interface_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr
    [sVar1].id = id;
    (pSVar2->interface_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
    buffer_size = sVar1 + 1;
  }
  return;
}

Assistant:

void CompilerMSL::mark_implicit_builtin(StorageClass storage, BuiltIn builtin, uint32_t id)
{
	Bitset *active_builtins = nullptr;
	switch (storage)
	{
	case StorageClassInput:
		active_builtins = &active_input_builtins;
		break;

	case StorageClassOutput:
		active_builtins = &active_output_builtins;
		break;

	default:
		break;
	}

	assert(active_builtins != nullptr);
	active_builtins->set(builtin);

	auto &var = get_entry_point().interface_variables;
	if (find(begin(var), end(var), VariableID(id)) == end(var))
		var.push_back(id);
}